

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_buffer.cpp
# Opt level: O2

BmsWord __thiscall BmsBuffer::Get(BmsBuffer *this,barindex pos)

{
  _Rb_tree<int,_std::pair<const_int,_BmsWord>,_std::_Select1st<std::pair<const_int,_BmsWord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
  *this_00;
  const_iterator cVar1;
  mapped_type *pmVar2;
  undefined4 in_register_00000034;
  key_type local_1c;
  
  this_00 = (_Rb_tree<int,_std::pair<const_int,_BmsWord>,_std::_Select1st<std::pair<const_int,_BmsWord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
             *)(CONCAT44(in_register_00000034,pos) + 8);
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_BmsWord>,_std::_Select1st<std::pair<const_int,_BmsWord>_>,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
          ::find(this_00,&local_1c);
  if (cVar1._M_node == (_Base_ptr)(CONCAT44(in_register_00000034,pos) + 0x10)) {
    BmsWord::BmsWord((BmsWord *)this,0);
  }
  else {
    pmVar2 = std::map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
             ::at((map<int,_BmsWord,_std::less<int>,_std::allocator<std::pair<const_int,_BmsWord>_>_>
                   *)this_00,&local_1c);
    *(int *)&this->_vptr_BmsBuffer = pmVar2->value_;
  }
  return (BmsWord)(int)this;
}

Assistant:

BmsWord
BmsBuffer::Get(barindex pos) const
{
	if (array_.find(pos) == array_.end()) return 0;
	else return array_.at(pos);
}